

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall SpikeEvent::SpikeEvent(SpikeEvent *this)

{
  Clock *this_00;
  Event *in_RDI;
  double dVar1;
  
  Event::Event(in_RDI);
  in_RDI->_vptr_Event = (_func_int **)&PTR_setWeight_001279f0;
  *(undefined4 *)&in_RDI[1]._vptr_Event = 1;
  *(undefined8 *)&in_RDI[1].type = 0x3ff0000000000000;
  in_RDI->type = Spike;
  this_00 = Clock::getInstance();
  dVar1 = Clock::getCurrentTime(this_00);
  in_RDI->eventTime = dVar1;
  return;
}

Assistant:

SpikeEvent() {
        type = EventType::Spike;
        eventTime = Clock::getInstance()->getCurrentTime();
    }